

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::GeneratedMessageReflection::HasOneofField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  return *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                 (ulong)(uint)((int)((*(long *)(field + 0x60) -
                                     *(long *)(*(long *)(*(long *)(field + 0x60) + 0x10) + 0x40)) /
                                    0x30) * 4 + (this->schema_).oneof_case_offset_)) ==
         *(int *)(field + 0x38);
}

Assistant:

inline bool GeneratedMessageReflection::HasOneofField(
    const Message& message, const FieldDescriptor* field) const {
  return (GetOneofCase(message, field->containing_oneof()) == field->number());
}